

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::GetFileSize(PosixEnv *this,string *filename,uint64_t *size)

{
  int iVar1;
  char *__file;
  undefined8 *in_RCX;
  char *in_RDI;
  stat file_stat;
  undefined4 local_80;
  int in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff88;
  
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)&stack0xffffffffffffff50);
  if (iVar1 == 0) {
    *in_RCX = CONCAT44(in_stack_ffffffffffffff84,local_80);
    Status::OK();
  }
  else {
    *in_RCX = 0;
    __errno_location();
    PosixError(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  }
  return (Status)in_RDI;
}

Assistant:

Status GetFileSize(const std::string& filename, uint64_t* size) override {
    struct ::stat file_stat;
    if (::stat(filename.c_str(), &file_stat) != 0) {
      *size = 0;
      return PosixError(filename, errno);
    }
    *size = file_stat.st_size;
    return Status::OK();
  }